

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

void __thiscall PenguinV_Image::ImageTemplate<short>::fill(ImageTemplate<short> *this,short value)

{
  uint uVar1;
  uint uVar2;
  short *psVar3;
  FunctionFacade *this_00;
  _func_void_short_ptr_short_unsigned_long *UNRECOVERED_JUMPTABLE;
  
  psVar3 = this->_data;
  if (psVar3 != (short *)0x0) {
    uVar1 = this->_height;
    uVar2 = this->_rowSize;
    this_00 = FunctionFacade::instance();
    UNRECOVERED_JUMPTABLE =
         __PenguinV_Image__ImageTemplate<short>__FunctionFacade___getFunction<void(*)(short*,short,unsigned_long)>_std__vector<void(*)(short*,short,unsigned_long),std::allocator<void(*)(short*,short,unsigned_long)>>const__unsigned_char_const_
                   (this_00,&this_00->_set,this->_type);
    (*UNRECOVERED_JUMPTABLE)(psVar3,value,(ulong)uVar2 * (ulong)uVar1 * 2);
    return;
  }
  return;
}

Assistant:

bool empty() const
        {
            return _data == nullptr;
        }